

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zeFenceCreate
          (ze_command_queue_handle_t hCommandQueue,ze_fence_desc_t *desc,ze_fence_handle_t *phFence)

{
  ze_result_t zVar1;
  
  if (DAT_0010e508 != (code *)0x0) {
    zVar1 = (*DAT_0010e508)();
    return zVar1;
  }
  context_t::get()::count = (ze_fence_handle_t)((long)context_t::get()::count + 1);
  *phFence = context_t::get()::count;
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFenceCreate(
        ze_command_queue_handle_t hCommandQueue,        ///< [in] handle of command queue
        const ze_fence_desc_t* desc,                    ///< [in] pointer to fence descriptor
        ze_fence_handle_t* phFence                      ///< [out] pointer to handle of fence object created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnCreate = context.zeDdiTable.Fence.pfnCreate;
        if( nullptr != pfnCreate )
        {
            result = pfnCreate( hCommandQueue, desc, phFence );
        }
        else
        {
            // generic implementation
            *phFence = reinterpret_cast<ze_fence_handle_t>( context.get() );

        }

        return result;
    }